

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

void __thiscall
Centaurus::ATNNode<wchar_t>::ATNNode
          (ATNNode<wchar_t> *this,ATNNode<wchar_t> *old,
          vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
          *transitions)

{
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_00197168;
  std::
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>::
  vector(&this->m_transitions,transitions);
  this->m_type = old->m_type;
  Identifier::Identifier(&this->m_invoke,&old->m_invoke);
  NFA<wchar_t>::NFA(&this->m_nfa,&old->m_nfa);
  std::__cxx11::wstring::wstring((wstring *)&this->m_literal,(wstring *)&old->m_literal);
  this->m_localid = old->m_localid;
  return;
}

Assistant:

ATNNode(const ATNNode<TCHAR>& old, std::vector<ATNTransition<TCHAR> >&& transitions)
        : m_transitions(transitions), m_type(old.m_type), m_invoke(old.m_invoke), m_nfa(old.m_nfa), m_literal(old.m_literal), m_localid(old.m_localid)
    {
    }